

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  Descriptor *pDVar2;
  long lVar3;
  long lVar4;
  ctrl_t *pcVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  slot_type *ppFVar18;
  ulong uVar19;
  size_t sVar20;
  uint64_t v_3;
  byte bVar21;
  size_t sVar22;
  ctrl_t cVar23;
  ulong uVar24;
  FindInfo FVar25;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  undefined1 local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe14,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("!set->fits_in_soo(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe15,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  sVar20 = common->capacity_;
  if (sVar20 == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  uVar1 = common->size_;
  if (1 < uVar1 && sVar20 == 1) {
    ppFVar18 = soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         *)common);
    pDVar2 = (*ppFVar18)->containing_type_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pDVar2;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = &pDVar2->super_SymbolBase +
                   (SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),8));
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),0) ^
         SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)(uint)(*ppFVar18)->number_;
    bVar21 = (SUB161(auVar10 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB161(auVar10 * ZEXT816(0x9ddfea08eb382d69),0)) & 0x7f;
    local_40 = (byte)common->size_;
    local_48 = common->capacity_;
  }
  else {
    bVar21 = 0x80;
    local_40 = (byte)uVar1;
    local_48 = sVar20;
  }
  local_40 = local_40 & 1;
  local_3f = sVar20 == 1;
  local_58._0_4_ = *(undefined4 *)&common->heap_or_soo_;
  local_58._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
  local_58._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
  local_58._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
  common->capacity_ = new_capacity;
  local_3e = 1 < uVar1 && sVar20 == 1;
  bVar17 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                     ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar21,8,8);
  if (local_48 == 0) {
    __assert_fail("resize_helper.old_capacity() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe38,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  if (sVar20 != 1 || 1 < uVar1) {
    lVar3 = *(long *)((long)&common->heap_or_soo_ + 8);
    slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)common->capacity_);
    if (!bVar17) {
      if (sVar20 == 1) {
        lVar4 = *(long *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 0x20);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = (long)&hash_internal::MixingHashState::kSeed + lVar4;
        auVar12._8_8_ = 0;
        auVar12._0_8_ =
             (SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),0) ^
             SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),8)) + lVar4;
        auVar13._8_8_ = 0;
        auVar13._0_8_ =
             (SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),0) ^
             SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),8)) +
             (ulong)*(uint *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4);
        uVar24 = SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),8) ^
                 SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),0);
        FVar25 = absl::lts_20240722::container_internal::find_first_non_full<void>(common,uVar24);
        uVar19 = FVar25.offset;
        uVar1 = common->capacity_;
        if (uVar1 <= uVar19) {
LAB_002033c0:
          __assert_fail("i < c.capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x70c,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar23 = (ctrl_t)uVar24 & ~kEmpty;
        pcVar5 = (common->heap_or_soo_).heap.control;
        pcVar5[uVar19] = cVar23;
        pcVar5[(ulong)((uint)uVar1 & 0xf) + (uVar19 - 0xf & uVar1)] = cVar23;
        *(ulong *)(lVar3 + uVar19 * 8) = CONCAT44(local_58._4_4_,local_58._0_4_);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7c2,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          lVar4 = CONCAT44(local_58._12_4_,local_58._8_4_);
          sVar22 = 0;
          sVar20 = local_48;
          do {
            if (local_3f == '\x01') {
              __assert_fail("!was_soo_",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7be,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (-1 < *(char *)(CONCAT44(local_58._4_4_,local_58._0_4_) + sVar22)) {
              lVar6 = *(long *)(lVar4 + sVar22 * 8);
              lVar7 = *(long *)(lVar6 + 0x20);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = (long)&hash_internal::MixingHashState::kSeed + lVar7;
              auVar15._8_8_ = 0;
              auVar15._0_8_ =
                   (SUB168(auVar14 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar14 * ZEXT816(0x9ddfea08eb382d69),8)) + lVar7;
              auVar16._8_8_ = 0;
              auVar16._0_8_ =
                   (SUB168(auVar15 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar15 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)*(uint *)(lVar6 + 4);
              uVar24 = SUB168(auVar16 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar16 * ZEXT816(0x9ddfea08eb382d69),0);
              FVar25 = absl::lts_20240722::container_internal::find_first_non_full<void>
                                 (common,uVar24);
              uVar19 = FVar25.offset;
              uVar1 = common->capacity_;
              if (uVar1 <= uVar19) goto LAB_002033c0;
              cVar23 = (ctrl_t)uVar24 & ~kEmpty;
              pcVar5 = (common->heap_or_soo_).heap.control;
              pcVar5[uVar19] = cVar23;
              pcVar5[(ulong)((uint)uVar1 & 0xf) + (uVar19 - 0xf & uVar1)] = cVar23;
              *(undefined8 *)(lVar3 + uVar19 * 8) = *(undefined8 *)(lVar4 + sVar22 * 8);
              sVar20 = local_48;
            }
            sVar22 = sVar22 + 1;
          } while (sVar22 != sVar20);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }